

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O2

void __thiscall
btSimpleBroadphase::calculateOverlappingPairs(btSimpleBroadphase *this,btDispatcher *dispatcher)

{
  _func_int **pp_Var1;
  btBroadphasePair *pbVar2;
  btSimpleBroadphaseProxy *proxy0;
  btSimpleBroadphaseProxy *proxy1;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  btSimpleBroadphaseProxy *pbVar5;
  btSimpleBroadphaseProxy *pbVar6;
  ulong uVar7;
  undefined8 *puVar8;
  btSimpleBroadphaseProxy *p0;
  btSimpleBroadphaseProxy *p1;
  long lVar9;
  long lVar10;
  ulong uVar11;
  btBroadphasePair local_58;
  undefined4 extraout_var_01;
  
  if (-1 < this->m_numHandles) {
    iVar4 = this->m_LastHandleIndex;
    uVar7 = 0xffffffffffffffff;
    lVar10 = 0x40;
    for (uVar11 = 0; (long)uVar11 <= (long)iVar4; uVar11 = uVar11 + 1) {
      if (this->m_pHandles[uVar11].super_btBroadphaseProxy.m_clientObject != (void *)0x0) {
        pbVar5 = this->m_pHandles + uVar11;
        lVar9 = lVar10;
        for (uVar7 = uVar11; (long)uVar7 < (long)iVar4; uVar7 = uVar7 + 1) {
          if (*(long *)((long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                       lVar9 + -0x1c) != 0) {
            pbVar6 = (btSimpleBroadphaseProxy *)
                     ((long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                     lVar9 + -0x1c);
            bVar3 = aabbOverlap(pbVar5,pbVar6);
            pp_Var1 = (this->m_pairCache->super_btOverlappingPairCallback).
                      _vptr_btOverlappingPairCallback;
            if (bVar3) {
              iVar4 = (*pp_Var1[0xd])(this->m_pairCache,pbVar5,pbVar6);
              if (CONCAT44(extraout_var,iVar4) == 0) {
                (*(this->m_pairCache->super_btOverlappingPairCallback).
                  _vptr_btOverlappingPairCallback[2])(this->m_pairCache,pbVar5,pbVar6);
              }
            }
            else {
              iVar4 = (*pp_Var1[0xe])();
              if ((char)iVar4 == '\0') {
                iVar4 = (*(this->m_pairCache->super_btOverlappingPairCallback).
                          _vptr_btOverlappingPairCallback[0xd])(this->m_pairCache,pbVar5,pbVar6);
                if (CONCAT44(extraout_var_00,iVar4) != 0) {
                  (*(this->m_pairCache->super_btOverlappingPairCallback).
                    _vptr_btOverlappingPairCallback[3])(this->m_pairCache,pbVar5,pbVar6,dispatcher);
                }
              }
            }
          }
          iVar4 = this->m_LastHandleIndex;
          lVar9 = lVar9 + 0x40;
        }
        uVar7 = uVar11 & 0xffffffff;
      }
      lVar10 = lVar10 + 0x40;
    }
    this->m_LastHandleIndex = (int)uVar7;
    if (this->m_ownsPairCache == true) {
      iVar4 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
                [0xe])();
      if ((char)iVar4 != '\0') {
        iVar4 = (*(this->m_pairCache->super_btOverlappingPairCallback).
                  _vptr_btOverlappingPairCallback[7])();
        this_00 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var_01,iVar4);
        btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
                  (this_00,(btBroadphasePairSortPredicate *)&local_58);
        local_58.m_algorithm = (btCollisionAlgorithm *)0x0;
        local_58.field_3.m_internalInfo1 = (void *)0x0;
        local_58.m_pProxy0 = (btBroadphaseProxy *)0x0;
        local_58.m_pProxy1 = (btBroadphaseProxy *)0x0;
        btAlignedObjectArray<btBroadphasePair>::resize
                  (this_00,this_00->m_size - this->m_invalidPair,&local_58);
        this->m_invalidPair = 0;
        lVar10 = 0;
        pbVar5 = (btSimpleBroadphaseProxy *)0x0;
        pbVar6 = (btSimpleBroadphaseProxy *)0x0;
        for (lVar9 = 0; lVar9 < this_00->m_size; lVar9 = lVar9 + 1) {
          pbVar2 = this_00->m_data;
          proxy0 = *(btSimpleBroadphaseProxy **)((long)&pbVar2->m_pProxy0 + lVar10);
          proxy1 = *(btSimpleBroadphaseProxy **)((long)&pbVar2->m_pProxy1 + lVar10);
          if (pbVar6 == proxy1 && pbVar5 == proxy0) {
LAB_0013589f:
            puVar8 = (undefined8 *)((long)&pbVar2->m_pProxy0 + lVar10);
            (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
              [8])(this->m_pairCache,puVar8,dispatcher);
            *puVar8 = 0;
            puVar8[1] = 0;
            this->m_invalidPair = this->m_invalidPair + 1;
            gOverlappingPairs = gOverlappingPairs + -1;
          }
          else {
            bVar3 = aabbOverlap(proxy0,proxy1);
            if (!bVar3) goto LAB_0013589f;
          }
          lVar10 = lVar10 + 0x20;
          pbVar5 = proxy0;
          pbVar6 = proxy1;
        }
        btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
                  (this_00,(btBroadphasePairSortPredicate *)&local_58);
        local_58.m_algorithm = (btCollisionAlgorithm *)0x0;
        local_58.field_3.m_internalInfo1 = (void *)0x0;
        local_58.m_pProxy0 = (btBroadphaseProxy *)0x0;
        local_58.m_pProxy1 = (btBroadphaseProxy *)0x0;
        btAlignedObjectArray<btBroadphasePair>::resize
                  (this_00,this_00->m_size - this->m_invalidPair,&local_58);
        this->m_invalidPair = 0;
      }
    }
  }
  return;
}

Assistant:

void	btSimpleBroadphase::calculateOverlappingPairs(btDispatcher* dispatcher)
{
	//first check for new overlapping pairs
	int i,j;
	if (m_numHandles >= 0)
	{
		int new_largest_index = -1;
		for (i=0; i <= m_LastHandleIndex; i++)
		{
			btSimpleBroadphaseProxy* proxy0 = &m_pHandles[i];
			if(!proxy0->m_clientObject)
			{
				continue;
			}
			new_largest_index = i;
			for (j=i+1; j <= m_LastHandleIndex; j++)
			{
				btSimpleBroadphaseProxy* proxy1 = &m_pHandles[j];
				btAssert(proxy0 != proxy1);
				if(!proxy1->m_clientObject)
				{
					continue;
				}

				btSimpleBroadphaseProxy* p0 = getSimpleProxyFromProxy(proxy0);
				btSimpleBroadphaseProxy* p1 = getSimpleProxyFromProxy(proxy1);

				if (aabbOverlap(p0,p1))
				{
					if ( !m_pairCache->findPair(proxy0,proxy1))
					{
						m_pairCache->addOverlappingPair(proxy0,proxy1);
					}
				} else
				{
					if (!m_pairCache->hasDeferredRemoval())
					{
						if ( m_pairCache->findPair(proxy0,proxy1))
						{
							m_pairCache->removeOverlappingPair(proxy0,proxy1,dispatcher);
						}
					}
				}
			}
		}

		m_LastHandleIndex = new_largest_index;

		if (m_ownsPairCache && m_pairCache->hasDeferredRemoval())
		{

			btBroadphasePairArray&	overlappingPairArray = m_pairCache->getOverlappingPairArray();

			//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
			overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

			overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
			m_invalidPair = 0;


			btBroadphasePair previousPair;
			previousPair.m_pProxy0 = 0;
			previousPair.m_pProxy1 = 0;
			previousPair.m_algorithm = 0;


			for (i=0;i<overlappingPairArray.size();i++)
			{

				btBroadphasePair& pair = overlappingPairArray[i];

				bool isDuplicate = (pair == previousPair);

				previousPair = pair;

				bool needsRemoval = false;

				if (!isDuplicate)
				{
					bool hasOverlap = testAabbOverlap(pair.m_pProxy0,pair.m_pProxy1);

					if (hasOverlap)
					{
						needsRemoval = false;//callback->processOverlap(pair);
					} else
					{
						needsRemoval = true;
					}
				} else
				{
					//remove duplicate
					needsRemoval = true;
					//should have no algorithm
					btAssert(!pair.m_algorithm);
				}

				if (needsRemoval)
				{
					m_pairCache->cleanOverlappingPair(pair,dispatcher);

					//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
					//		m_overlappingPairArray.pop_back();
					pair.m_pProxy0 = 0;
					pair.m_pProxy1 = 0;
					m_invalidPair++;
					gOverlappingPairs--;
				} 

			}

			///if you don't like to skip the invalid pairs in the array, execute following code:
#define CLEAN_INVALID_PAIRS 1
#ifdef CLEAN_INVALID_PAIRS

			//perform a sort, to sort 'invalid' pairs to the end
			overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

			overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
			m_invalidPair = 0;
#endif//CLEAN_INVALID_PAIRS

		}
	}
}